

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

int __thiscall glslang::TScanContext::identifierOrReserved(TScanContext *this,bool reserved)

{
  TParseContextBase *pTVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,reserved) != 0) {
    reservedWord(this);
    return 0;
  }
  pTVar1 = this->parseContext;
  if ((pTVar1->super_TParseVersions).forwardCompatible == true) {
    (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[0x2e])
              (pTVar1,&this->loc,"using future reserved keyword",this->tokenText,"");
  }
  iVar2 = identifierOrType(this);
  return iVar2;
}

Assistant:

int TScanContext::identifierOrReserved(bool reserved)
{
    if (reserved) {
        reservedWord();

        return 0;
    }

    if (parseContext.isForwardCompatible())
        parseContext.warn(loc, "using future reserved keyword", tokenText, "");

    return identifierOrType();
}